

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

ItemList *
Lib::UniquePersistentIterator<Lib::Stack<Kernel::Clause_*>::Iterator>::getUniqueItemList
          (Iterator *inn,size_t *sizeRef)

{
  Clause *pCVar1;
  bool bVar2;
  Clause **ppCVar3;
  ItemList *pIVar4;
  ItemList *pIVar5;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_38;
  
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_38);
  *sizeRef = 0;
  ppCVar3 = (inn->super_RefIterator)._pointer;
  if (ppCVar3 == ((inn->super_RefIterator)._stack)->_stack) {
    pIVar4 = (ItemList *)0x0;
  }
  else {
    pIVar5 = (ItemList *)0x0;
    do {
      (inn->super_RefIterator)._pointer = ppCVar3 + -1;
      pCVar1 = ppCVar3[-1];
      bVar2 = DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        ((DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_38._self._M_t.
                            super___uniq_ptr_impl<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            .
                            super__Head_base<0UL,_Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                            ._M_head_impl,pCVar1);
      pIVar4 = pIVar5;
      if (bVar2) {
        pIVar4 = (ItemList *)
                 FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        pIVar4->_head = pCVar1;
        pIVar4->_tail = pIVar5;
        *sizeRef = *sizeRef + 1;
      }
      ppCVar3 = (inn->super_RefIterator)._pointer;
      pIVar5 = pIVar4;
    } while (ppCVar3 != ((inn->super_RefIterator)._stack)->_stack);
  }
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_38);
  return pIVar4;
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }